

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeNVT::moveA(FluctuatingChargeNVT *this)

{
  double dVar1;
  double dVar2;
  pointer ppAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  long lVar6;
  long lVar7;
  Molecule *pMVar8;
  pointer ppAVar9;
  Atom *pAVar10;
  long lVar11;
  RealType RVar12;
  double dVar13;
  pair<double,_double> pVar14;
  MoleculeIterator i;
  double local_40;
  double local_30;
  MoleculeIterator local_28;
  pair<double,_double> local_20;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_28._M_node = (_Base_ptr)0x0;
    pVar14 = Snapshot::getElectronicThermostat(this->snap);
    RVar12 = Thermo::getElectronicTemperature(&this->thermo);
    pMVar8 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_28);
    while (local_30 = pVar14.second, local_40 = pVar14.first, pMVar8 != (Molecule *)0x0) {
      ppAVar9 = (pMVar8->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar3 = (pMVar8->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar9 != ppAVar3) goto LAB_001d3795;
      pAVar10 = (Atom *)0x0;
      while (pAVar10 != (Atom *)0x0) {
        DVar4 = (pAVar10->super_StuntDouble).storage_;
        pSVar5 = ((pAVar10->super_StuntDouble).snapshotMan_)->currentSnapshot_;
        lVar11 = (long)(pAVar10->super_StuntDouble).localIndex_;
        lVar6 = *(long *)((long)&(pSVar5->atomData).flucQPos.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar4);
        lVar7 = *(long *)((long)&(pSVar5->atomData).flucQVel.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar4);
        dVar13 = *(double *)(lVar7 + lVar11 * 8);
        dVar13 = ((*(double *)
                    (*(long *)((long)&(pSVar5->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + DVar4) + lVar11 * 8) *
                  this->dt2_) / pAVar10->chargeMass_ - this->dt2_ * local_40 * dVar13) + dVar13;
        dVar1 = this->dt_;
        dVar2 = *(double *)(lVar6 + lVar11 * 8);
        *(double *)(lVar7 + lVar11 * 8) = dVar13;
        *(double *)(lVar6 + lVar11 * 8) = dVar1 * dVar13 + dVar2;
        ppAVar9 = ppAVar9 + 1;
        pAVar10 = (Atom *)0x0;
        if (ppAVar9 != ppAVar3) {
LAB_001d3795:
          pAVar10 = *ppAVar9;
        }
      }
      pMVar8 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_28);
    }
    local_20.first =
         local_40 +
         ((RVar12 / this->targetTemp_ + -1.0) * this->dt2_) /
         (this->tauThermostat_ * this->tauThermostat_);
    local_20.second = this->dt2_ * local_20.first + local_30;
    Snapshot::setElectronicThermostat(this->snap,&local_20);
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::moveA() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos, cfrc, cmass;

    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType integralOfChidt            = thermostat.second;
    RealType instTemp                   = thermo.getElectronicTemperature();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cpos  = atom->getFlucQPos();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass - dt2_ * chi * cvel;
        // position whole step
        cpos += dt_ * cvel;

        atom->setFlucQVel(cvel);
        atom->setFlucQPos(cpos);
      }
    }

    chi += dt2_ * (instTemp / targetTemp_ - 1.0) /
           (tauThermostat_ * tauThermostat_);

    integralOfChidt += chi * dt2_;
    snap->setElectronicThermostat(make_pair(chi, integralOfChidt));
  }